

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_ReportsTransitiveMissingImports_LeafFirst_Test::TestBody
          (CommandLineInterfaceTest_ReportsTransitiveMissingImports_LeafFirst_Test *this)

{
  string_view local_b8 [2];
  allocator<char> local_91;
  string local_90;
  string_view local_70;
  string_view local_60;
  string_view local_50;
  string_view local_40;
  string_view local_30;
  string_view local_20;
  CommandLineInterfaceTest_ReportsTransitiveMissingImports_LeafFirst_Test *local_10;
  CommandLineInterfaceTest_ReportsTransitiveMissingImports_LeafFirst_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,"unused.proto")
  ;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,"syntax = \"proto2\";\nmessage Unused {}\n");
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_20,local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"bar.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,"syntax = \"proto2\";\nimport \"unused.proto\";\nmessage Bar {}\n");
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_40,local_50);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,"foo.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_70,
             "syntax = \"proto2\";\nimport \"bar.proto\";\nmessage Foo {\n  optional Bar bar = 1;\n}\n"
            );
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_60,local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,
             "protocol_compiler --test_out=$tmpdir --proto_path=$tmpdir bar.proto foo.proto",
             &local_91);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_b8,"bar.proto:2:1: warning: Import unused.proto is unused.");
  CommandLineInterfaceTester::ExpectWarningSubstring((CommandLineInterfaceTester *)this,local_b8[0])
  ;
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, ReportsTransitiveMissingImports_LeafFirst) {
  CreateTempFile("unused.proto",
                 "syntax = \"proto2\";\n"
                 "message Unused {}\n");
  CreateTempFile("bar.proto",
                 "syntax = \"proto2\";\n"
                 "import \"unused.proto\";\n"
                 "message Bar {}\n");
  CreateTempFile("foo.proto",
                 "syntax = \"proto2\";\n"
                 "import \"bar.proto\";\n"
                 "message Foo {\n"
                 "  optional Bar bar = 1;\n"
                 "}\n");

  Run("protocol_compiler --test_out=$tmpdir "
      "--proto_path=$tmpdir bar.proto foo.proto");
  ExpectWarningSubstring(
      "bar.proto:2:1: warning: Import unused.proto is unused.");
}